

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_base.h
# Opt level: O0

void __thiscall bandit::reporter::progress_base::it_unknown_error(progress_base *this,string *desc)

{
  ostream *poVar1;
  value_type local_1f0;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  string *local_18;
  string *desc_local;
  progress_base *this_local;
  
  this->specs_failed_ = this->specs_failed_ + 1;
  local_18 = desc;
  desc_local = (string *)this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::ostream::operator<<(local_190,std::endl<char,std::char_traits<char>>);
  current_context_name_abi_cxx11_(&local_1d0,this);
  poVar1 = std::operator<<(local_190,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)local_18);
  poVar1 = std::operator<<(poVar1,":");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::operator<<(local_190,"Unknown exception");
  std::ostream::operator<<(local_190,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::str();
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->failures_,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void it_unknown_error(const std::string& desc) override {
        specs_failed_++;

        std::stringstream ss;
        ss << std::endl;
        ss << current_context_name() << " " << desc << ":" << std::endl;
        ss << "Unknown exception";
        ss << std::endl;

        failures_.push_back(ss.str());
      }